

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O3

void __thiscall Assimp::LWO::AnimResolver::UpdateAnimRangeSetup(AnimResolver *this)

{
  double *pdVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  _List_node_base *p_Var5;
  iterator __position;
  Key *pKVar6;
  double dVar7;
  double __y;
  double dVar8;
  double dVar9;
  _List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *this_00;
  bool bVar10;
  bool bVar11;
  long lVar12;
  void *pvVar13;
  iterator iVar14;
  _List_node_base *p_Var15;
  uint uVar16;
  long lVar17;
  Key *pKVar18;
  int iVar19;
  ulong uVar20;
  size_t __n;
  ulong uVar21;
  _List_node_base *p_Var22;
  long lVar23;
  ulong uVar24;
  size_type __n_00;
  void *pvVar25;
  _List_node_base *p_Var26;
  undefined1 local_68 [8];
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  void *local_38;
  
  p_Var26 = (this->envelopes->
            super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>)._M_impl
            ._M_node.super__List_node_base._M_next;
  if (p_Var26 != (_List_node_base *)this->envelopes) {
    do {
      p_Var15 = *(_List_node_base **)
                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  (p_Var26 + 2))->_M_impl;
      p_Var22 = *(_List_node_base **)
                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  ((long)(p_Var26 + 2) + 8))->_M_impl;
      if ((p_Var15 != p_Var22) && (*(int *)((long)(p_Var26 + 1) + 8) - 2U < 3)) {
        this_00 = (_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                  (p_Var26 + 2);
        p_Var5 = p_Var15->_M_next;
        fVar3 = *(float *)&p_Var22[-2]._M_next;
        fVar4 = *(float *)&p_Var15->_M_prev;
        __y = (double)p_Var22[-3]._M_prev - (double)p_Var5;
        dVar7 = fmod((double)p_Var5 - this->first,__y);
        dVar7 = __y - dVar7;
        __position._M_current =
             *(Key **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *
                        )(p_Var26 + 2))->_M_impl;
        pKVar6 = *(Key **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                             *)((long)(p_Var26 + 2) + 8))->_M_impl;
        lVar17 = (long)pKVar6 - (long)__position._M_current;
        lVar12 = (lVar17 >> 3) * -0x3333333333333333;
        lVar23 = lVar12 >> 2;
        iVar14._M_current = __position._M_current;
        if (0 < lVar23) {
          iVar14._M_current = __position._M_current + lVar23 * 4;
          lVar23 = lVar23 + 1;
          pKVar18 = __position._M_current + 2;
          do {
            if (pKVar18[-2].time <= dVar7 && dVar7 != pKVar18[-2].time) {
              pKVar18 = pKVar18 + -2;
              goto LAB_0067ddb1;
            }
            if (pKVar18[-1].time <= dVar7 && dVar7 != pKVar18[-1].time) {
              pKVar18 = pKVar18 + -1;
              goto LAB_0067ddb1;
            }
            if (pKVar18->time <= dVar7 && dVar7 != pKVar18->time) goto LAB_0067ddb1;
            if (pKVar18[1].time <= dVar7 && dVar7 != pKVar18[1].time) {
              pKVar18 = pKVar18 + 1;
              goto LAB_0067ddb1;
            }
            lVar23 = lVar23 + -1;
            pKVar18 = pKVar18 + 4;
          } while (1 < lVar23);
          lVar17 = (long)pKVar6 - (long)iVar14._M_current;
        }
        lVar17 = (lVar17 >> 3) * -0x3333333333333333;
        if (lVar17 == 1) {
LAB_0067dda4:
          pKVar18 = iVar14._M_current;
          if ((iVar14._M_current)->time <= dVar7 && dVar7 != (iVar14._M_current)->time)
          goto LAB_0067ddb1;
LAB_0067de40:
          __n_00 = 0;
        }
        else {
          if (lVar17 == 2) {
LAB_0067dd83:
            pKVar18 = iVar14._M_current;
            if (dVar7 < (iVar14._M_current)->time || dVar7 == (iVar14._M_current)->time) {
              iVar14._M_current = iVar14._M_current + 1;
              goto LAB_0067dda4;
            }
          }
          else {
            if (lVar17 != 3) goto LAB_0067de40;
            pKVar18 = iVar14._M_current;
            if (dVar7 < (iVar14._M_current)->time || dVar7 == (iVar14._M_current)->time) {
              iVar14._M_current = iVar14._M_current + 1;
              goto LAB_0067dd83;
            }
          }
LAB_0067ddb1:
          if (pKVar18 == pKVar6) goto LAB_0067de40;
          lVar12 = (long)pKVar6 - (long)pKVar18 >> 3;
          __n_00 = lVar12 * -0x3333333333333333;
          local_68 = (undefined1  [8])0x0;
          dStack_60 = 2.12199579096527e-314;
          local_58 = 0.0;
          dStack_50 = 0.0;
          local_48 = (double)((ulong)local_48 & 0xffffffff00000000);
          std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::_M_fill_insert
                    ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)this_00,
                     __position,__n_00,(value_type *)local_68);
          memmove(*(_List_node_base **)
                   &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                    (p_Var26 + 2))->_M_impl,
                  (void *)(lVar12 * -8 +
                          *(size_t *)
                           &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                              *)((long)(p_Var26 + 2) + 8))->_M_impl),(long)pKVar6 - (long)pKVar18);
          lVar12 = ((long)(*(size_t *)
                            &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                               *)((long)(p_Var26 + 2) + 8))->_M_impl -
                          (long)*(_List_node_base **)
                                 &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                    *)(p_Var26 + 2))->_M_impl) >> 3) * -0x3333333333333333;
        }
        __n = (long)p_Var22 - (long)p_Var15;
        uVar21 = ((long)__n >> 3) * -0x3333333333333333;
        uVar20 = (ulong)(((double)p_Var5 - this->first) / __y);
        iVar19 = (int)uVar20;
        uVar20 = uVar20 & 0xffffffff;
        std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::resize
                  ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)this_00,
                   uVar21 * uVar20 + lVar12);
        if (iVar19 != 0) {
          pvVar25 = (void *)((long)*(_List_node_base **)&this_00->_M_impl + __n_00 * 0x28);
          lVar12 = ((long)__n >> 3) * 8;
          lVar17 = (long)p_Var22 +
                   (long)*(_List_node_base **)&this_00->_M_impl +
                   (__n_00 * 0x28 - (long)p_Var15) + -0x50;
          uVar24 = 0;
          bVar11 = false;
          local_38 = pvVar25;
          do {
            uVar24 = uVar24 + 1;
            pvVar13 = (void *)((long)local_38 + uVar21 * uVar24 * 0x28);
            memmove(pvVar13,local_38,__n);
            bVar10 = bVar11;
            if (*(int *)((long)(p_Var26 + 1) + 8) == 3) {
              if (bVar11) {
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if ((pvVar13 != (void *)((long)pvVar13 + (__n - 0x28))) &&
                   (pvVar13 < (void *)((long)pvVar13 + (__n - 0x50)))) {
                  pvVar13 = pvVar25;
                  lVar23 = lVar17;
                  do {
                    pdVar1 = (double *)((long)pvVar13 + lVar12);
                    local_48 = pdVar1[4];
                    local_68 = (undefined1  [8])*pdVar1;
                    dStack_60 = pdVar1[1];
                    local_58 = pdVar1[2];
                    dStack_50 = pdVar1[3];
                    pdVar2 = (double *)(lVar23 + -0x28 + lVar12);
                    *(undefined4 *)(pdVar1 + 4) = *(undefined4 *)(pdVar2 + 9);
                    dVar7 = pdVar2[5];
                    dVar8 = pdVar2[6];
                    dVar9 = pdVar2[8];
                    pdVar1[2] = pdVar2[7];
                    pdVar1[3] = dVar9;
                    *pdVar1 = dVar7;
                    pdVar1[1] = dVar8;
                    *(float *)(pdVar2 + 9) = local_48._0_4_;
                    pdVar2[7] = local_58;
                    pdVar2[8] = dStack_50;
                    pdVar2[5] = (double)local_68;
                    pdVar2[6] = dStack_60;
                    lVar23 = lVar23 + -0x28;
                    pvVar13 = (void *)((long)pvVar13 + 0x28);
                    bVar10 = (bool)(bVar11 ^ 1);
                  } while (pdVar1 + 5 < pdVar2);
                }
              }
            }
            bVar11 = bVar10;
            lVar17 = lVar17 + lVar12;
            pvVar25 = (void *)((long)pvVar25 + lVar12);
          } while (uVar24 != uVar20);
        }
        dVar7 = (double)(iVar19 + 1) * __y;
        if (__y <= dVar7) {
          p_Var15 = (_List_node_base *)
                    (~uVar21 * 0x28 +
                    *(size_t *)
                     &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                      ((long)(p_Var26 + 2) + 8))->_M_impl);
          uVar16 = 1;
          dVar8 = __y;
          do {
            if ((__y != dVar7) || (NAN(__y) || NAN(dVar7))) {
              p_Var22 = (_List_node_base *)((long)p_Var15 + ~uVar21 * 0x28);
            }
            else {
              p_Var22 = *(_List_node_base **)&this_00->_M_impl;
            }
            if (p_Var22 != p_Var15) {
              do {
                p_Var15->_M_next = (_List_node_base *)((double)p_Var15->_M_next - dVar8);
                if (*(int *)((long)(p_Var26 + 1) + 8) == 4) {
                  *(float *)&p_Var15->_M_prev =
                       *(float *)&p_Var15->_M_prev + (float)uVar16 * (fVar3 - fVar4);
                }
                p_Var15 = (_List_node_base *)&p_Var15[-3]._M_prev;
              } while (p_Var15 != p_Var22);
            }
            dVar8 = dVar8 + __y;
            uVar16 = uVar16 + 1;
          } while (dVar8 <= dVar7);
        }
      }
      p_Var26 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                 &p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var26 != (_List_node_base *)this->envelopes);
  }
  return;
}

Assistant:

void AnimResolver::UpdateAnimRangeSetup()
{
    // XXX doesn't work yet (hangs if more than one envelope channels needs to be interpolated)

    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {
        if ((*it).keys.empty()) continue;

        const double my_first = (*it).keys.front().time;
        const double my_last  = (*it).keys.back().time;

        const double delta = my_last-my_first;
        const size_t old_size = (*it).keys.size();

        const float value_delta = (*it).keys.back().value - (*it).keys.front().value;

        // NOTE: We won't handle reset, linear and constant here.
        // See DoInterpolation() for their implementation.

        // process pre behaviour
        switch ((*it).pre) {
            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:
                {
                const double start_time = delta - std::fmod(my_first-first,delta);
                std::vector<LWO::Key>::iterator n = std::find_if((*it).keys.begin(),(*it).keys.end(),
                    [start_time](double t) { return start_time > t; }),m;

                size_t ofs = 0;
                if (n != (*it).keys.end()) {
                    // copy from here - don't use iterators, insert() would invalidate them
                    ofs = (*it).keys.end()-n;
                    (*it).keys.insert((*it).keys.begin(),ofs,LWO::Key());

                    std::copy((*it).keys.end()-ofs,(*it).keys.end(),(*it).keys.begin());
                }

                // do full copies. again, no iterators
                const unsigned int num = (unsigned int)((my_first-first) / delta);
                (*it).keys.resize((*it).keys.size() + num*old_size);

                n = (*it).keys.begin()+ofs;
                bool reverse = false;
                for (unsigned int i = 0; i < num; ++i) {
                    m = n+old_size*(i+1);
                    std::copy(n,n+old_size,m);

                    if ((*it).pre == LWO::PrePostBehaviour_Oscillate && (reverse = !reverse))
                        std::reverse(m,m+old_size-1);
                }

                // update time values
                n = (*it).keys.end() - (old_size+1);
                double cur_minus = delta;
                unsigned int tt = 1;
                for (const double tmp =  delta*(num+1);cur_minus <= tmp;cur_minus += delta,++tt) {
                    m = (delta == tmp ? (*it).keys.begin() :  n - (old_size+1));
                    for (;m != n; --n) {
                        (*n).time -= cur_minus;

                        // offset repeat? add delta offset to key value
                        if ((*it).pre == LWO::PrePostBehaviour_OffsetRepeat) {
                            (*n).value += tt * value_delta;
                        }
                    }
                }
                break;
                }
            default:
                // silence compiler warning
                break;
        }

        // process post behaviour
        switch ((*it).post) {

            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:

                break;

            default:
                // silence compiler warning
                break;
        }
    }
}